

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::SetIsClosed(ScriptContext *this)

{
  Cache *pCVar1;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar2;
  BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar3;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType local_18;
  undefined4 local_14;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  HRESULT hr;
  ScriptContext *this_local;
  
  if (((this->super_ScriptContextBase).isClosed & 1U) == 0) {
    (this->super_ScriptContextBase).isClosed = true;
    ___autoNestedHandledExceptionType = this;
    if ((this->super_ScriptContextBase).javascriptLibrary != (JavascriptLibrary *)0x0) {
      DynamicProfileInfo::DumpScriptContext(this);
      DynamicProfileInfo::DumpScriptContextToFile(this);
      local_14 = 0;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (&local_18,ExceptionType_OutOfMemory);
      DynamicProfileInfo::Save(this);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_18);
      pCVar1 = Cache(this);
      ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                          ((WriteBarrierPtr *)&pCVar1->sourceContextInfoMap);
      if (*ppBVar2 !=
          (BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *)0x0) {
        pCVar1 = Cache(this);
        pBVar3 = Memory::
                 WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 ::operator->(&pCVar1->sourceContextInfoMap);
        JsUtil::
        BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::Map<Js::ScriptContext::SetIsClosed()::__0>
                  ((BaseDictionary<unsigned_long,SourceContextInfo*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)pBVar3);
      }
      ClearDynamicProfileList(this);
    }
    PrintStats(this);
  }
  return;
}

Assistant:

void ScriptContext::SetIsClosed()
    {
        if (!this->isClosed)
        {
            this->isClosed = true;

            if (this->javascriptLibrary)
            {
                JS_ETW(EtwTrace::LogSourceUnloadEvents(this));

#if ENABLE_PROFILE_INFO
#if DBG_DUMP
                DynamicProfileInfo::DumpScriptContext(this);
#endif
#ifdef RUNTIME_DATA_COLLECTION
                DynamicProfileInfo::DumpScriptContextToFile(this);
#endif
#endif

#if ENABLE_PROFILE_INFO
#ifdef DYNAMIC_PROFILE_STORAGE
                HRESULT hr = S_OK;
                BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
                {
                    DynamicProfileInfo::Save(this);
                }
                END_TRANSLATE_OOM_TO_HRESULT(hr);

                if (this->Cache()->sourceContextInfoMap)
                {
                    this->Cache()->sourceContextInfoMap->Map([&](DWORD_PTR dwHostSourceContext, SourceContextInfo * sourceContextInfo)
                    {
                        if (sourceContextInfo->sourceDynamicProfileManager)
                        {
                            sourceContextInfo->sourceDynamicProfileManager->ClearSavingData();
                        }
                    });
                }
#endif

#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
                this->ClearDynamicProfileList();
#endif
#endif
            }

            this->PrintStats();
        }
    }